

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_TextureCopy_x_to_x(SBlitJob *job)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long in_RDI;
  float fVar4;
  float fVar5;
  u32 dy_2;
  void *dst_2;
  void *src_2;
  size_t widthPitch;
  u32 dx_1;
  f18 src_x_1;
  u32 dy_1;
  u16 *dst_1;
  u16 *src_1;
  u32 dx;
  f18 src_x;
  u32 dy;
  u32 *dst;
  u32 *src;
  f18 src_y;
  f18 hscale;
  f18 wscale;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined4 local_14;
  
  if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
    iVar1 = *(int *)(in_RDI + 0x38);
    iVar2 = *(int *)(in_RDI + 0x44);
    local_68 = *(void **)(in_RDI + 0x28);
    local_70 = *(void **)(in_RDI + 0x30);
    for (local_74 = 0; local_74 < *(uint *)(in_RDI + 0x3c); local_74 = local_74 + 1) {
      memcpy(local_70,local_68,(ulong)(uint)(iVar1 * iVar2));
      local_68 = (void *)((long)local_68 + (long)*(int *)(in_RDI + 0x48));
      local_70 = (void *)((long)local_70 + (ulong)*(uint *)(in_RDI + 0x4c));
    }
  }
  else {
    fVar4 = floorf(*(float *)(in_RDI + 0x54) * 262144.0 + 0.0);
    fVar5 = floorf(*(float *)(in_RDI + 0x58) * 262144.0 + 0.0);
    local_14 = 0;
    if (*(int *)(in_RDI + 0x40) == 4) {
      local_28 = *(long *)(in_RDI + 0x30);
      for (local_2c = 0; local_2c < *(uint *)(in_RDI + 0x3c); local_2c = local_2c + 1) {
        lVar3 = *(long *)(in_RDI + 0x28);
        iVar1 = *(int *)(in_RDI + 0x48);
        local_30 = 0;
        for (local_34 = 0; local_34 < *(uint *)(in_RDI + 0x38); local_34 = local_34 + 1) {
          *(undefined4 *)(local_28 + (ulong)local_34 * 4) =
               *(undefined4 *)(lVar3 + iVar1 * (local_14 >> 0x12) + (long)(local_30 >> 0x12) * 4);
          local_30 = (int)fVar4 + local_30;
        }
        local_28 = local_28 + (ulong)*(uint *)(in_RDI + 0x4c);
        local_14 = (int)fVar5 + local_14;
      }
    }
    else if (*(int *)(in_RDI + 0x40) == 2) {
      local_48 = *(long *)(in_RDI + 0x30);
      for (local_4c = 0; local_4c < *(uint *)(in_RDI + 0x3c); local_4c = local_4c + 1) {
        lVar3 = *(long *)(in_RDI + 0x28);
        iVar1 = *(int *)(in_RDI + 0x48);
        local_50 = 0;
        for (local_54 = 0; local_54 < *(uint *)(in_RDI + 0x38); local_54 = local_54 + 1) {
          *(undefined2 *)(local_48 + (ulong)local_54 * 2) =
               *(undefined2 *)(lVar3 + iVar1 * (local_14 >> 0x12) + (long)(local_50 >> 0x12) * 2);
          local_50 = (int)fVar4 + local_50;
        }
        local_48 = local_48 + (ulong)*(uint *)(in_RDI + 0x4c);
        local_14 = (int)fVar5 + local_14;
      }
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_x_to_x(const SBlitJob *job)
{
	if (job->stretch) {
		const f18 wscale = f32_to_f18(job->x_stretch);
		const f18 hscale = f32_to_f18(job->y_stretch);

		f18 src_y = f18_zero;

		if (job->srcPixelMul == 4) {
			const u32 *src = (u32 *)(job->src);
			u32 *dst = (u32 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u32 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u32 *)((u8 *)(dst) + job->dstPitch);
			}
		} else if (job->srcPixelMul == 2) {
			const u16 *src = (u16 *)(job->src);
			u16 *dst = (u16 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u16 *)((u8 *)(dst) + job->dstPitch);
			}
		}
	} else {
		const size_t widthPitch = job->width * job->dstPixelMul;
		const void *src = (void *)job->src;
		void *dst = (void *)job->dst;

		for (u32 dy = 0; dy < job->height; ++dy) {
			memcpy(dst, src, widthPitch);

			src = (void *)((u8 *)(src) + job->srcPitch);
			dst = (void *)((u8 *)(dst) + job->dstPitch);
		}
	}
}